

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffdecode.c
# Opt level: O1

FT_Error cff_decoder_prepare(CFF_Decoder *decoder,CFF_Size size,FT_UInt glyph_index)

{
  uint uVar1;
  void *pvVar2;
  byte bVar3;
  FT_Error FVar4;
  uint uVar5;
  FT_Int FVar6;
  FT_Size ftsize;
  CFF_SubFont pCVar7;
  
  pvVar2 = (((decoder->builder).face)->extra).data;
  pCVar7 = (CFF_SubFont)((long)pvVar2 + 0x668);
  FVar6 = 0;
  if (*(int *)((long)pvVar2 + 0xb30) == 0) {
    FVar4 = 0;
  }
  else {
    bVar3 = (**(code **)(*(long *)((long)pvVar2 + 0x1368) + 0x10))
                      ((long)pvVar2 + 0x1338,glyph_index);
    uVar1 = *(uint *)((long)pvVar2 + 0xb30);
    FVar4 = 3;
    uVar5 = (uint)bVar3;
    if (bVar3 < uVar1) {
      pCVar7 = *(CFF_SubFont *)((long)pvVar2 + (ulong)uVar5 * 8 + 0xb38);
      FVar4 = 0;
      if ((size != (CFF_Size)0x0) && ((decoder->builder).hints_funcs != (void *)0x0)) {
        (decoder->builder).hints_globals =
             *(void **)((long)((size->root).internal)->module_data + (ulong)uVar5 * 8 + 8);
      }
    }
    if (uVar1 <= uVar5) {
      return FVar4;
    }
  }
  uVar1 = (pCVar7->local_subrs_index).count;
  decoder->num_locals = uVar1;
  decoder->locals = pCVar7->local_subrs;
  if ((((decoder->cff->top_font).font_dict.charstring_type != 1) && (FVar6 = 0x6b, 0x4d7 < uVar1))
     && (FVar6 = 0x8000, uVar1 < 0x846c)) {
    FVar6 = 0x46b;
  }
  decoder->locals_bias = FVar6;
  decoder->glyph_width = (pCVar7->private_dict).default_width;
  decoder->nominal_width = (pCVar7->private_dict).nominal_width;
  decoder->current_subfont = pCVar7;
  return FVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  cff_decoder_prepare( CFF_Decoder*  decoder,
                       CFF_Size      size,
                       FT_UInt       glyph_index )
  {
    CFF_Builder  *builder = &decoder->builder;
    CFF_Font      cff     = (CFF_Font)builder->face->extra.data;
    CFF_SubFont   sub     = &cff->top_font;
    FT_Error      error   = FT_Err_Ok;

    FT_Service_CFFLoad  cffload = (FT_Service_CFFLoad)cff->cffload;


    /* manage CID fonts */
    if ( cff->num_subfonts )
    {
      FT_Byte  fd_index = cffload->fd_select_get( &cff->fd_select,
                                                  glyph_index );


      if ( fd_index >= cff->num_subfonts )
      {
        FT_TRACE4(( "cff_decoder_prepare: invalid CID subfont index\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Exit;
      }

      FT_TRACE3(( "  in subfont %d:\n", fd_index ));

      sub = cff->subfonts[fd_index];

      if ( builder->hints_funcs && size )
      {
        FT_Size       ftsize   = FT_SIZE( size );
        CFF_Internal  internal = (CFF_Internal)ftsize->internal->module_data;


        /* for CFFs without subfonts, this value has already been set */
        builder->hints_globals = (void *)internal->subfonts[fd_index];
      }
    }

    decoder->num_locals  = sub->local_subrs_index.count;
    decoder->locals      = sub->local_subrs;
    decoder->locals_bias = cff_compute_bias(
                             decoder->cff->top_font.font_dict.charstring_type,
                             decoder->num_locals );

    decoder->glyph_width   = sub->private_dict.default_width;
    decoder->nominal_width = sub->private_dict.nominal_width;

    decoder->current_subfont = sub;

  Exit:
    return error;
  }